

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdiSubWindowPrivate::setSizeGrip(QMdiSubWindowPrivate *this,QSizeGrip *newSizeGrip)

{
  QLayout *pQVar1;
  bool bVar2;
  Int IVar3;
  int iVar4;
  int iVar5;
  int __sig;
  QMdiSubWindowPrivate *in_RSI;
  QMdiSubWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  bool bVar6;
  bool putSizeGripInLayout;
  QMdiSubWindow *q;
  undefined4 in_stack_ffffffffffffff88;
  WindowType in_stack_ffffffffffffff8c;
  enum_type in_stack_ffffffffffffff90;
  enum_type in_stack_ffffffffffffff94;
  int iVar7;
  QSize *in_stack_ffffffffffffff98;
  QMdiSubWindowPrivate *pQVar8;
  QWidget *in_stack_ffffffffffffffa0;
  QWidget *w;
  QMdiSubWindowPrivate *in_stack_ffffffffffffffa8;
  QFlagsStorageHelper<Qt::WindowType,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  bVar6 = true;
  if (in_RSI != (QMdiSubWindowPrivate *)0x0) {
    bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QSizeGrip> *)0x6328f3);
    bVar6 = true;
    if (!bVar2) {
      QWidget::windowFlags((QWidget *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90))
      ;
      local_c.super_QFlagsStorage<Qt::WindowType>.i =
           (QFlagsStorage<Qt::WindowType>)
           QFlags<Qt::WindowType>::operator&
                     ((QFlags<Qt::WindowType> *)
                      CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff8c);
      IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c);
      bVar6 = IVar3 != 0;
    }
  }
  if ((!bVar6) &&
     (((in_RDI->super_QWidgetPrivate).layout == (QLayout *)0x0 ||
      (pQVar1 = (in_RDI->super_QWidgetPrivate).layout,
      iVar4 = (**(code **)(*(long *)pQVar1 + 0xb8))(pQVar1,in_RSI), iVar4 == -1)))) {
    pQVar8 = in_RSI;
    (**(code **)(*(long *)&in_RSI->super_QWidgetPrivate + 0x70))();
    QWidget::setFixedSize(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    pQVar1 = (in_RDI->super_QWidgetPrivate).layout;
    QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    bVar6 = isMacStyle((QStyle *)in_stack_ffffffffffffffa0);
    if (bVar6 || pQVar1 == (QLayout *)0x0) {
      QWidget::setParent((QWidget *)pQVar8,(QWidget *)in_stack_ffffffffffffffa8);
      pQVar8 = in_RSI;
      bVar6 = QWidget::isLeftToRight((QWidget *)0x632a5a);
      if (bVar6) {
        in_stack_ffffffffffffff90 = QWidget::width((QWidget *)0x632a6a);
        iVar4 = QWidget::width((QWidget *)0x632a78);
        iVar4 = in_stack_ffffffffffffff90 - iVar4;
      }
      else {
        iVar4 = 0;
      }
      iVar7 = iVar4;
      iVar5 = QWidget::height((QWidget *)0x632aa0);
      QWidget::height((QWidget *)0x632aad);
      QWidget::move(in_stack_ffffffffffffffa0,(int)((ulong)pQVar8 >> 0x20),(int)pQVar8);
      __sig = (int)in_RSI;
      QPointer<QSizeGrip>::operator=
                ((QPointer<QSizeGrip> *)CONCAT44(iVar7,in_stack_ffffffffffffff90),
                 (QSizeGrip *)CONCAT44(iVar4,iVar5));
    }
    else {
      QLayout::addWidget((QLayout *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         (QWidget *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      w = (QWidget *)(in_RDI->super_QWidgetPrivate).layout;
      in_stack_ffffffffffffffa8 = in_RSI;
      Qt::operator|(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
      __sig = (int)in_stack_ffffffffffffffa8;
      QLayout::setAlignment
                ((QLayout *)in_stack_ffffffffffffffa8,w,
                 (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)in_RDI >> 0x20,0));
    }
    QWidget::raise((QWidget *)in_RSI,__sig);
    updateGeometryConstraints(in_stack_ffffffffffffffa8);
    QObject::installEventFilter((QObject *)in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindowPrivate::setSizeGrip(QSizeGrip *newSizeGrip)
{
    Q_Q(QMdiSubWindow);
    if (!newSizeGrip || sizeGrip || q->windowFlags() & Qt::FramelessWindowHint)
        return;

    if (layout && layout->indexOf(newSizeGrip) != -1)
        return;
    newSizeGrip->setFixedSize(newSizeGrip->sizeHint());
    bool putSizeGripInLayout = layout ? true : false;
    if (isMacStyle(q->style()))
        putSizeGripInLayout = false;
    if (putSizeGripInLayout) {
        layout->addWidget(newSizeGrip);
        layout->setAlignment(newSizeGrip, Qt::AlignBottom | Qt::AlignRight);
    } else {
        newSizeGrip->setParent(q);
        newSizeGrip->move(q->isLeftToRight() ? q->width() - newSizeGrip->width() : 0,
                          q->height() - newSizeGrip->height());
        sizeGrip = newSizeGrip;
    }
    newSizeGrip->raise();
    updateGeometryConstraints();
    newSizeGrip->installEventFilter(q);
}